

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall dgPolyhedra::DeleteEdge(dgPolyhedra *this,dgEdge *edge)

{
  HaI32 *pHVar1;
  dgTreeNode **head;
  dgEdge *pdVar2;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  dgTreeNode *node;
  
  pdVar2 = edge->m_twin;
  pdVar3 = edge->m_prev;
  pdVar4 = pdVar2->m_next;
  pdVar3->m_next = pdVar4;
  pdVar4->m_prev = pdVar3;
  pdVar3 = pdVar2->m_prev;
  pdVar4 = edge->m_next;
  pdVar4->m_prev = pdVar3;
  pdVar3->m_next = pdVar4;
  if (((edge[-1].m_mark & 2) != 0) && ((pdVar2[-1].m_mark & 2) != 0)) {
    pHVar1 = &(this->super_dgTree<dgEdge,_long>).m_count;
    *pHVar1 = *pHVar1 + -1;
    head = &(this->super_dgTree<dgEdge,_long>).m_head;
    dgRedBackNode::Remove((dgRedBackNode *)&edge[-1].m_userData,(dgRedBackNode **)head);
    pHVar1 = &(this->super_dgTree<dgEdge,_long>).m_count;
    *pHVar1 = *pHVar1 + -1;
    dgRedBackNode::Remove((dgRedBackNode *)&pdVar2[-1].m_userData,(dgRedBackNode **)head);
    return;
  }
  __assert_fail("retnode->IsInTree ()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTree.h"
                ,0x193,
                "typename dgTree<OBJECT, KEY>::dgTreeNode *dgTree<dgEdge, long>::GetNodeFromInfo(OBJECT &) const [OBJECT = dgEdge, KEY = long]"
               );
}

Assistant:

void dgPolyhedra::DeleteEdge (dgEdge* const edge)
{
	dgEdge *const twin = edge->m_twin;

	edge->m_prev->m_next = twin->m_next;
	twin->m_next->m_prev = edge->m_prev;
	edge->m_next->m_prev = twin->m_prev;
	twin->m_prev->m_next = edge->m_next;

	dgTreeNode *const nodeA = GetNodeFromInfo (*edge);
	dgTreeNode *const nodeB = GetNodeFromInfo (*twin);

	HACD_ASSERT (&nodeA->GetInfo() == edge);
	HACD_ASSERT (&nodeB->GetInfo() == twin);

	Remove (nodeA);
	Remove (nodeB);
}